

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
parser::Parser::Parser
          (Parser *this,Grammar *grammar,bool debug,TerminalNames *terminalNames,
          NonTerminalNames *nonTerminalNames)

{
  NonTerminal nonTerminal_00;
  State SVar1;
  size_t sVar2;
  State state;
  const_iterator cVar3;
  bool bVar4;
  pointer ppVar5;
  reference pvVar6;
  reference __x;
  pointer pGVar7;
  size_type sVar8;
  size_type sVar9;
  reference piVar10;
  Situation *pSVar11;
  reference pvVar12;
  pointer pSVar13;
  vector<parser::ActionState,_std::allocator<parser::ActionState>_> *this_00;
  pointer pSVar14;
  const_reference pvVar15;
  iterator __first;
  iterator __last;
  reference piVar16;
  ulong uVar17;
  State *pSVar18;
  ostream *poVar19;
  void *this_01;
  pointer this_02;
  pair<std::_Rb_tree_const_iterator<parser::GrammaticSymbol>,_bool> pVar20;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar21;
  string local_2a8;
  __normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
  local_288;
  __normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
  local_280;
  iterator item_1;
  State j_1;
  undefined1 local_268 [8];
  Situations gts;
  _Self local_248;
  iterator nonTerminal;
  __normal_iterator<parser::ActionState_*,_std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>_>
  local_228;
  vector<parser::ActionState,_std::allocator<parser::ActionState>_> *local_220;
  vector<parser::ActionState,_std::allocator<parser::ActionState>_> *actions;
  ActionState actionState;
  size_t j;
  undefined1 local_1f0 [8];
  Situations goToSits;
  _Self local_1c0;
  _Self local_1b8;
  iterator terminal;
  __normal_iterator<parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
  local_1a8;
  __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
  local_1a0;
  const_iterator situation;
  size_t i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_188;
  iterator gt;
  _Self local_170;
  _Self local_168;
  iterator symbol_1;
  UniqueNonTerminals uniqueNonTerminals;
  _Self local_120;
  _Self local_118;
  iterator symbol;
  UniqueTerminals uniqueTerminals;
  CanonicalSet canonicalSet;
  __normal_iterator<const_parser::GrammaticSymbol_*,_std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>
  local_b8;
  __normal_iterator<const_parser::GrammaticSymbol_*,_std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>
  local_b0;
  const_iterator item;
  __normal_iterator<const_std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_*,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>
  local_a0;
  const_iterator variants;
  GrammaticSymbol local_88;
  _Self local_80;
  _Self local_78;
  const_iterator rule;
  UniqueGrammaticSymbols uniqueGrammaticSymbols;
  NonTerminalNames *nonTerminalNames_local;
  TerminalNames *terminalNames_local;
  bool debug_local;
  Grammar *grammar_local;
  Parser *this_local;
  
  std::
  vector<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>,_std::allocator<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>_>_>
  ::vector(&this->actionTable);
  std::vector<int,_std::allocator<int>_>::vector(&this->goToTable);
  this->states = 0;
  this->terminals = 0;
  this->nonTerminals = 0;
  this->debug = debug;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->terminalNames,terminalNames);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->nonTerminalNames,nonTerminalNames);
  std::
  set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
  ::set((set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
         *)&rule);
  local_78._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>_>_>
       ::begin(grammar);
  while( true ) {
    local_80._M_node =
         (_Base_ptr)
         std::
         map<int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>_>_>
         ::end(grammar);
    bVar4 = std::operator!=(&local_78,&local_80);
    if (!bVar4) break;
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>_>
             ::operator->(&local_78);
    GrammaticSymbol::GrammaticSymbol(&local_88,ppVar5->first,false);
    pVar20 = std::
             set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
             ::insert((set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
                       *)&rule,&local_88);
    variants._M_current =
         (vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_> *)
         pVar20.first._M_node;
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>_>
             ::operator->(&local_78);
    local_a0._M_current =
         (vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_> *)
         std::
         vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>
         ::begin(&ppVar5->second);
    while( true ) {
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>_>
               ::operator->(&local_78);
      item._M_current =
           (GrammaticSymbol *)
           std::
           vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>
           ::end(&ppVar5->second);
      bVar4 = __gnu_cxx::operator!=
                        (&local_a0,
                         (__normal_iterator<const_std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_*,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>
                          *)&item);
      if (!bVar4) break;
      pvVar6 = __gnu_cxx::
               __normal_iterator<const_std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_*,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>
               ::operator*(&local_a0);
      local_b0._M_current =
           (GrammaticSymbol *)
           std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::begin
                     (pvVar6);
      while( true ) {
        pvVar6 = __gnu_cxx::
                 __normal_iterator<const_std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_*,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>
                 ::operator*(&local_a0);
        local_b8._M_current =
             (GrammaticSymbol *)
             std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::end
                       (pvVar6);
        bVar4 = __gnu_cxx::operator!=(&local_b0,&local_b8);
        if (!bVar4) break;
        __x = __gnu_cxx::
              __normal_iterator<const_parser::GrammaticSymbol_*,_std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>
              ::operator*(&local_b0);
        std::
        set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
        ::insert((set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
                  *)&rule,__x);
        __gnu_cxx::
        __normal_iterator<const_parser::GrammaticSymbol_*,_std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>
        ::operator++(&local_b0);
      }
      __gnu_cxx::
      __normal_iterator<const_std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_*,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>
      ::operator++(&local_a0);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>_>
    ::operator++(&local_78);
  }
  items((CanonicalSet *)&uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count,this,
        grammar,(UniqueGrammaticSymbols *)&rule);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&symbol);
  local_118._M_node =
       (_Base_ptr)
       std::
       set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
       ::begin((set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
                *)&rule);
  while( true ) {
    local_120._M_node =
         (_Base_ptr)
         std::
         set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
         ::end((set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
                *)&rule);
    bVar4 = std::operator!=(&local_118,&local_120);
    if (!bVar4) break;
    pGVar7 = std::_Rb_tree_const_iterator<parser::GrammaticSymbol>::operator->(&local_118);
    if ((pGVar7->isTerminal & 1U) != 0) {
      pGVar7 = std::_Rb_tree_const_iterator<parser::GrammaticSymbol>::operator->(&local_118);
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&symbol,&pGVar7->value);
    }
    std::_Rb_tree_const_iterator<parser::GrammaticSymbol>::operator++(&local_118);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&symbol_1);
  local_168._M_node =
       (_Base_ptr)
       std::
       set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
       ::begin((set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
                *)&rule);
  while( true ) {
    local_170._M_node =
         (_Base_ptr)
         std::
         set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
         ::end((set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
                *)&rule);
    bVar4 = std::operator!=(&local_168,&local_170);
    if (!bVar4) break;
    pGVar7 = std::_Rb_tree_const_iterator<parser::GrammaticSymbol>::operator->(&local_168);
    if ((pGVar7->isTerminal & 1U) == 0) {
      pGVar7 = std::_Rb_tree_const_iterator<parser::GrammaticSymbol>::operator->(&local_168);
      pVar21 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)&symbol_1,&pGVar7->value
                         );
      gt._M_current = (int *)pVar21.first._M_node;
    }
    std::_Rb_tree_const_iterator<parser::GrammaticSymbol>::operator++(&local_168);
  }
  sVar8 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::size
                    ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *)
                     &uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count);
  this->states = sVar8;
  sVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)&symbol);
  this->terminals = sVar9;
  sVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)&symbol_1);
  this->nonTerminals = sVar9;
  std::
  vector<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>,_std::allocator<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>_>_>
  ::resize(&this->actionTable,this->states * this->terminals);
  std::vector<int,_std::allocator<int>_>::resize(&this->goToTable,this->states * this->nonTerminals)
  ;
  local_188._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->goToTable);
  while( true ) {
    i = (size_t)std::vector<int,_std::allocator<int>_>::end(&this->goToTable);
    bVar4 = __gnu_cxx::operator!=
                      (&local_188,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i);
    if (!bVar4) break;
    piVar10 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&local_188);
    *piVar10 = -1;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_188);
  }
  for (situation._M_current = (Situation *)0x0; cVar3._M_current = situation._M_current,
      pSVar11 = (Situation *)
                std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::size
                          ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *)
                           &uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count),
      cVar3._M_current < pSVar11;
      situation._M_current =
           (Situation *)((long)&((situation._M_current)->super_Convolution)._vptr_Convolution + 1))
  {
    pvVar12 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                        ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *)
                         &uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (size_type)situation._M_current);
    local_1a8._M_current =
         (Situation *)
         std::vector<parser::Situation,_std::allocator<parser::Situation>_>::begin
                   (&pvVar12->situations);
    __gnu_cxx::
    __normal_iterator<parser::Situation_const*,std::vector<parser::Situation,std::allocator<parser::Situation>>>
    ::__normal_iterator<parser::Situation*>
              ((__normal_iterator<parser::Situation_const*,std::vector<parser::Situation,std::allocator<parser::Situation>>>
                *)&local_1a0,&local_1a8);
    while( true ) {
      pvVar12 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                          ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *)
                           &uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (size_type)situation._M_current);
      terminal._M_node =
           (_Base_ptr)
           std::vector<parser::Situation,_std::allocator<parser::Situation>_>::end
                     (&pvVar12->situations);
      bVar4 = __gnu_cxx::operator!=
                        (&local_1a0,
                         (__normal_iterator<parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
                          *)&terminal);
      if (!bVar4) break;
      local_1b8._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)&symbol);
      while( true ) {
        local_1c0._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)&symbol);
        bVar4 = std::operator!=(&local_1b8,&local_1c0);
        if (!bVar4) break;
        pSVar13 = __gnu_cxx::
                  __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
                  ::operator->(&local_1a0);
        sVar8 = std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::size
                          (&(pSVar13->super_Convolution).body);
        pSVar13 = __gnu_cxx::
                  __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
                  ::operator->(&local_1a0);
        if (sVar8 == pSVar13->point) {
          SVar1 = (State)situation._M_current;
          piVar16 = std::_Rb_tree_const_iterator<int>::operator*(&local_1b8);
          this_00 = getAction(this,SVar1,*piVar16);
          pSVar13 = __gnu_cxx::
                    __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
                    ::operator->(&local_1a0);
          if ((pSVar13->super_Convolution).header == 0) {
            ActionState::ActionState
                      ((ActionState *)
                       &goToSits.
                        super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,Accept,0,0,0);
          }
          else {
            SVar1 = (State)situation._M_current;
            pSVar13 = __gnu_cxx::
                      __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
                      ::operator->(&local_1a0);
            nonTerminal_00 = (pSVar13->super_Convolution).header;
            pSVar13 = __gnu_cxx::
                      __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
                      ::operator->(&local_1a0);
            sVar8 = std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::
                    size(&(pSVar13->super_Convolution).body);
            ActionState::ActionState
                      ((ActionState *)
                       &goToSits.
                        super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,Reduce,SVar1,
                       nonTerminal_00,sVar8);
          }
          std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>::push_back
                    (this_00,(value_type *)
                             &goToSits.
                              super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          pSVar13 = __gnu_cxx::
                    __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
                    ::operator->(&local_1a0);
          pSVar14 = __gnu_cxx::
                    __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
                    ::operator->(&local_1a0);
          pvVar15 = std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::
                    at(&(pSVar13->super_Convolution).body,pSVar14->point);
          if ((pvVar15->isTerminal & 1U) != 0) {
            pvVar12 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                                ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                  *)&uniqueTerminals._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count,(size_type)situation._M_current);
            piVar16 = std::_Rb_tree_const_iterator<int>::operator*(&local_1b8);
            GrammaticSymbol::GrammaticSymbol((GrammaticSymbol *)&j,*piVar16,true);
            goTo((Situations *)local_1f0,this,grammar,&pvVar12->situations,(GrammaticSymbol *)&j);
            for (actionState.reduceCount = 0; sVar2 = actionState.reduceCount,
                sVar8 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::
                        size((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                              *)&uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count),
                sVar2 < sVar8; actionState.reduceCount = actionState.reduceCount + 1) {
              pvVar12 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::
                        at((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *)
                           &uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           actionState.reduceCount);
              bVar4 = std::operator==(&pvVar12->situations,
                                      (vector<parser::Situation,_std::allocator<parser::Situation>_>
                                       *)local_1f0);
              if (bVar4) {
                ActionState::ActionState
                          ((ActionState *)&actions,Shift,(State)actionState.reduceCount,0,0);
                SVar1 = (State)situation._M_current;
                piVar16 = std::_Rb_tree_const_iterator<int>::operator*(&local_1b8);
                local_220 = getAction(this,SVar1,*piVar16);
                __first = std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>::
                          begin(local_220);
                __last = std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>::end
                                   (local_220);
                local_228 = std::
                            find<__gnu_cxx::__normal_iterator<parser::ActionState*,std::vector<parser::ActionState,std::allocator<parser::ActionState>>>,parser::ActionState>
                                      (__first._M_current,__last._M_current,(ActionState *)&actions)
                ;
                nonTerminal._M_node =
                     (_Base_ptr)
                     std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>::end
                               (local_220);
                bVar4 = __gnu_cxx::operator==
                                  (&local_228,
                                   (__normal_iterator<parser::ActionState_*,_std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>_>
                                    *)&nonTerminal);
                if (bVar4) {
                  std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>::push_back
                            (local_220,(value_type *)&actions);
                }
              }
            }
            std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector
                      ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)local_1f0);
          }
        }
        std::_Rb_tree_const_iterator<int>::operator++(&local_1b8);
      }
      __gnu_cxx::
      __normal_iterator<const_parser::Situation_*,_std::vector<parser::Situation,_std::allocator<parser::Situation>_>_>
      ::operator++(&local_1a0);
    }
    local_248._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)&symbol_1);
    while( true ) {
      gts.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::set<int,_std::less<int>,_std::allocator<int>_>::end
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)&symbol_1);
      bVar4 = std::operator!=(&local_248,
                              (_Self *)&gts.
                                        super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar4) break;
      pvVar12 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                          ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *)
                           &uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (size_type)situation._M_current);
      piVar16 = std::_Rb_tree_const_iterator<int>::operator*(&local_248);
      GrammaticSymbol::GrammaticSymbol((GrammaticSymbol *)&stack0xfffffffffffffd90,*piVar16,false);
      goTo((Situations *)local_268,this,grammar,&pvVar12->situations,
           (GrammaticSymbol *)&stack0xfffffffffffffd90);
      for (item_1._M_current._4_4_ = 0; uVar17 = (ulong)item_1._M_current._4_4_,
          sVar8 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::size
                            ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                              *)&uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count),
          uVar17 < sVar8; item_1._M_current._4_4_ = item_1._M_current._4_4_ + 1) {
        pvVar12 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                            ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                              *)&uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (long)item_1._M_current._4_4_);
        bVar4 = std::operator==((vector<parser::Situation,_std::allocator<parser::Situation>_> *)
                                local_268,&pvVar12->situations);
        SVar1 = item_1._M_current._4_4_;
        if (bVar4) {
          state = (State)situation._M_current;
          piVar16 = std::_Rb_tree_const_iterator<int>::operator*(&local_248);
          pSVar18 = getGoTo(this,state,*piVar16);
          *pSVar18 = SVar1;
        }
      }
      std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector
                ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)local_268);
      std::_Rb_tree_const_iterator<int>::operator++(&local_248);
    }
  }
  if (debug) {
    poVar19 = std::operator<<((ostream *)&std::cout,"records in canonical set ");
    sVar8 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::size
                      ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *)
                       &uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count);
    this_01 = (void *)std::ostream::operator<<(poVar19,sVar8);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    local_280._M_current =
         (CanonicalItem *)
         std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::begin
                   ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *)
                    &uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count);
    while( true ) {
      local_288._M_current =
           (CanonicalItem *)
           std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::end
                     ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *)
                      &uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar4 = __gnu_cxx::operator!=(&local_280,&local_288);
      if (!bVar4) break;
      this_02 = __gnu_cxx::
                __normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
                ::operator->(&local_280);
      poVar19 = CanonicalItem::stringify
                          (this_02,(ostream *)&std::cout,terminalNames,nonTerminalNames);
      std::ostream::operator<<(poVar19,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
      ::operator++(&local_280);
    }
    poVar19 = dotStringify(this,(ostream *)&std::cout,grammar,
                           (CanonicalSet *)
                           &uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::ostream::operator<<(poVar19,std::endl<char,std::char_traits<char>>);
    stringifyTables_abi_cxx11_(&local_2a8,this);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&symbol_1);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&symbol);
  std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::~vector
            ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *)
             &uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
  ::~set((set<parser::GrammaticSymbol,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
          *)&rule);
  return;
}

Assistant:

explicit Parser(Grammar const& grammar = Grammar(),
                        bool debug = false,
                        lexer::TerminalNames const& terminalNames = lexer::TerminalNames(),
                        NonTerminalNames const& nonTerminalNames = NonTerminalNames()) :
                states(0), terminals(0), nonTerminals(0), debug(debug), terminalNames(terminalNames),
                nonTerminalNames(nonTerminalNames) {
            UniqueGrammaticSymbols uniqueGrammaticSymbols;
            for_each_c(Grammar, grammar, rule)
            {
                uniqueGrammaticSymbols.insert(GrammaticSymbol(rule->first, false));
                for_each_c(Alternative, rule->second, variants)
                    for_each_c(GrammaticSymbols, (*variants), item)
                        uniqueGrammaticSymbols.insert(*item);
            }

            CanonicalSet canonicalSet = items(grammar, uniqueGrammaticSymbols);

            UniqueTerminals uniqueTerminals;
            for_each(UniqueGrammaticSymbols, uniqueGrammaticSymbols, symbol)
                if (symbol->isTerminal)
                    uniqueTerminals.insert(symbol->value);
            UniqueNonTerminals uniqueNonTerminals;
            for_each(UniqueGrammaticSymbols, uniqueGrammaticSymbols, symbol)
                if (!symbol->isTerminal)
                    uniqueNonTerminals.insert(symbol->value);

            states = canonicalSet.size();
            terminals = uniqueTerminals.size();
            nonTerminals = uniqueNonTerminals.size();

            actionTable.resize(states * terminals);
            goToTable.resize(states * nonTerminals);
            for_each(StateTable, goToTable, gt) *gt = -1;

            for (size_t i = 0; i < canonicalSet.size(); ++i) {
                for_each_c(Situations, canonicalSet.at(i).situations, situation) {
                    for_each(UniqueTerminals, uniqueTerminals, terminal) {
                        if (situation->body.size() == situation->point) {
                            getAction(i, *terminal).push_back(
                                    situation->header == StartNonTerminal ? ActionState(Accept, 0, 0, 0)
                                                                          : ActionState(Reduce, i, situation->header, situation->body.size()));
                        } else {
                            if (!situation->body.at(situation->point).isTerminal)
                                continue;

                            Situations goToSits = goTo(grammar, canonicalSet.at(i).situations, GrammaticSymbol(*terminal));

                            for (size_t j = 0; j < canonicalSet.size(); ++j) {
                                if (canonicalSet.at(j).situations == goToSits) {
                                    ActionState actionState(Shift, j, 0, 0);
                                    std::vector<ActionState>& actions = getAction(i, *terminal);
                                    if (std::find(actions.begin(), actions.end(), actionState) == actions.end()) {
                                        actions.push_back(actionState);
                                    }
                                }
                            }
                        }
                    }
                }
                for_each(UniqueNonTerminals, uniqueNonTerminals, nonTerminal) {
                    Situations gts = goTo(grammar, canonicalSet.at(i).situations, GrammaticSymbol(*nonTerminal, false));
                    for (State j = 0; j < canonicalSet.size(); ++j) {
                        if (gts == canonicalSet.at(j).situations) {
                            getGoTo(i, *nonTerminal) = j;
                        }
                    }
                }
            }

            if (debug) {
                std::cout << "records in canonical set " << canonicalSet.size() << std::endl;
                for_each(CanonicalSet, canonicalSet, item)
                    item->stringify(std::cout, terminalNames, nonTerminalNames) << std::endl;
                dotStringify(std::cout, grammar, canonicalSet) << std::endl;
                stringifyTables();
            }
        }